

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_3xxx_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint rm_00;
  uint rn_00;
  uint rn;
  uint rm;
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  rm_00 = quads[1];
  rn_00 = quads[2];
  switch(*quads) {
  case 0:
    sh4asm_txt_cmpeq_rm_rn(em,rm_00,rn_00);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
    break;
  case 2:
    sh4asm_txt_cmphs_rm_rn(em,rm_00,rn_00);
    break;
  case 3:
    sh4asm_txt_cmpge_rm_rn(em,rm_00,rn_00);
    break;
  case 4:
    sh4asm_txt_div1_rm_rn(em,rm_00,rn_00);
    break;
  case 5:
    sh4asm_txt_dmulul_rm_rn(em,rm_00,rn_00);
    break;
  case 6:
    sh4asm_txt_cmphi_rm_rn(em,rm_00,rn_00);
    break;
  case 7:
    sh4asm_txt_cmpgt_rm_rn(em,rm_00,rn_00);
    break;
  case 8:
    sh4asm_txt_sub_rm_rn(em,rm_00,rn_00);
    break;
  case 10:
    sh4asm_txt_subc_rm_rn(em,rm_00,rn_00);
    break;
  case 0xb:
    sh4asm_txt_subv_rm_rn(em,rm_00,rn_00);
    break;
  case 0xc:
    sh4asm_txt_add_rm_rn(em,rm_00,rn_00);
    break;
  case 0xd:
    sh4asm_txt_dmulsl_rm_rn(em,rm_00,rn_00);
    break;
  case 0xe:
    sh4asm_txt_addc_rm_rn(em,rm_00,rn_00);
    break;
  case 0xf:
    sh4asm_txt_addv_rm_rn(em,rm_00,rn_00);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_3xxx_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    // mask is 0xf00f
    unsigned rm = quads[1];
    unsigned rn = quads[2];
    switch (quads[0]) {
    case 0:
        sh4asm_txt_cmpeq_rm_rn(em, rm, rn);
        break;
    case 2:
        sh4asm_txt_cmphs_rm_rn(em, rm, rn);
        break;
    case 3:
        sh4asm_txt_cmpge_rm_rn(em, rm, rn);
        break;
    case 4:
        sh4asm_txt_div1_rm_rn(em, rm, rn);
        break;
    case 5:
        sh4asm_txt_dmulul_rm_rn(em, rm, rn);
        break;
    case 6:
        sh4asm_txt_cmphi_rm_rn(em, rm, rn);
        break;
    case 7:
        sh4asm_txt_cmpgt_rm_rn(em, rm, rn);
        break;
    case 8:
        sh4asm_txt_sub_rm_rn(em, rm, rn);
        break;
    case 10:
        sh4asm_txt_subc_rm_rn(em, rm, rn);
        break;
    case 11:
        sh4asm_txt_subv_rm_rn(em, rm, rn);
        break;
    case 12:
        sh4asm_txt_add_rm_rn(em, rm, rn);
        break;
    case 13:
        sh4asm_txt_dmulsl_rm_rn(em, rm, rn);
        break;
    case 14:
        sh4asm_txt_addc_rm_rn(em, rm, rn);
        break;
    case 15:
        sh4asm_txt_addv_rm_rn(em, rm, rn);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}